

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfp_helper.c
# Opt level: O0

uint64_t recip_sqrt_estimate(int *exp,int exp_off,uint64_t frac)

{
  int iVar1;
  uint64_t uVar2;
  uint32_t local_28;
  uint32_t scaled;
  int estimate;
  uint64_t frac_local;
  int exp_off_local;
  int *exp_local;
  
  _scaled = frac;
  if (*exp == 0) {
    while (uVar2 = extract64(_scaled,0x33,1), uVar2 == 0) {
      _scaled = _scaled << 1;
      *exp = *exp + -1;
    }
    _scaled = extract64(_scaled,0,0x33);
    _scaled = _scaled << 1;
  }
  if ((*exp & 1U) == 0) {
    uVar2 = extract64(_scaled,0x2c,8);
    local_28 = deposit32(0x100,0,8,(uint32_t)uVar2);
  }
  else {
    uVar2 = extract64(_scaled,0x2d,7);
    local_28 = deposit32(0x80,0,7,(uint32_t)uVar2);
  }
  iVar1 = do_recip_sqrt_estimate(local_28);
  *exp = (exp_off - *exp) / 2;
  uVar2 = extract64((long)iVar1,0,8);
  return uVar2 << 0x2c;
}

Assistant:

static uint64_t recip_sqrt_estimate(int *exp , int exp_off, uint64_t frac)
{
    int estimate;
    uint32_t scaled;

    if (*exp == 0) {
        while (extract64(frac, 51, 1) == 0) {
            frac = frac << 1;
            *exp -= 1;
        }
        frac = extract64(frac, 0, 51) << 1;
    }

    if (*exp & 1) {
        /* scaled = UInt('01':fraction<51:45>) */
        scaled = deposit32(1 << 7, 0, 7, extract64(frac, 45, 7));
    } else {
        /* scaled = UInt('1':fraction<51:44>) */
        scaled = deposit32(1 << 8, 0, 8, extract64(frac, 44, 8));
    }
    estimate = do_recip_sqrt_estimate(scaled);

    *exp = (exp_off - *exp) / 2;
    return extract64(estimate, 0, 8) << 44;
}